

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DoWhileStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DoWhileStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::StatementSyntax&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,
          StatementSyntax *args_3,Token *args_4,Token *args_5,ExpressionSyntax *args_6,Token *args_7
          ,Token *args_8)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  TokenKind TVar18;
  undefined1 uVar19;
  NumericTokenFlags NVar20;
  uint32_t uVar21;
  TokenKind TVar22;
  undefined1 uVar23;
  NumericTokenFlags NVar24;
  uint32_t uVar25;
  DoWhileStatementSyntax *this_00;
  
  this_00 = (DoWhileStatementSyntax *)allocate(this,0xb8,8);
  TVar6 = args_2->kind;
  uVar7 = args_2->field_0x2;
  NVar8.raw = (args_2->numFlags).raw;
  uVar9 = args_2->rawLen;
  pIVar1 = args_2->info;
  TVar10 = args_4->kind;
  uVar11 = args_4->field_0x2;
  NVar12.raw = (args_4->numFlags).raw;
  uVar13 = args_4->rawLen;
  pIVar2 = args_4->info;
  TVar14 = args_5->kind;
  uVar15 = args_5->field_0x2;
  NVar16.raw = (args_5->numFlags).raw;
  uVar17 = args_5->rawLen;
  pIVar3 = args_5->info;
  TVar18 = args_7->kind;
  uVar19 = args_7->field_0x2;
  NVar20.raw = (args_7->numFlags).raw;
  uVar21 = args_7->rawLen;
  pIVar4 = args_7->info;
  TVar22 = args_8->kind;
  uVar23 = args_8->field_0x2;
  NVar24.raw = (args_8->numFlags).raw;
  uVar25 = args_8->rawLen;
  pIVar5 = args_8->info;
  slang::syntax::StatementSyntax::StatementSyntax
            ((StatementSyntax *)this_00,DoWhileStatement,*args,args_1);
  (this_00->doKeyword).kind = TVar6;
  (this_00->doKeyword).field_0x2 = uVar7;
  (this_00->doKeyword).numFlags = (NumericTokenFlags)NVar8.raw;
  (this_00->doKeyword).rawLen = uVar9;
  (this_00->doKeyword).info = pIVar1;
  (this_00->statement).ptr = args_3;
  (this_00->whileKeyword).kind = TVar10;
  (this_00->whileKeyword).field_0x2 = uVar11;
  (this_00->whileKeyword).numFlags = (NumericTokenFlags)NVar12.raw;
  (this_00->whileKeyword).rawLen = uVar13;
  (this_00->whileKeyword).info = pIVar2;
  (this_00->openParen).kind = TVar14;
  (this_00->openParen).field_0x2 = uVar15;
  (this_00->openParen).numFlags = (NumericTokenFlags)NVar16.raw;
  (this_00->openParen).rawLen = uVar17;
  (this_00->openParen).info = pIVar3;
  (this_00->expr).ptr = args_6;
  (this_00->closeParen).kind = TVar18;
  (this_00->closeParen).field_0x2 = uVar19;
  (this_00->closeParen).numFlags = (NumericTokenFlags)NVar20.raw;
  (this_00->closeParen).rawLen = uVar21;
  (this_00->closeParen).info = pIVar4;
  (this_00->semi).kind = TVar22;
  (this_00->semi).field_0x2 = uVar23;
  (this_00->semi).numFlags = (NumericTokenFlags)NVar24.raw;
  (this_00->semi).rawLen = uVar25;
  (this_00->semi).info = pIVar5;
  (args_3->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  (args_6->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }